

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

char position_window(Fl_Window *w,char *prefsName,int Visible,int X,int Y,int W,int H)

{
  char cVar1;
  undefined1 local_40 [8];
  Fl_Preferences pos;
  int W_local;
  int Y_local;
  int X_local;
  int Visible_local;
  char *prefsName_local;
  Fl_Window *w_local;
  
  pos.rootNode._0_4_ = W;
  pos.rootNode._4_4_ = Y;
  W_local = X;
  Y_local = Visible;
  _X_local = prefsName;
  prefsName_local = (char *)w;
  Fl_Preferences::Fl_Preferences((Fl_Preferences *)local_40,&fluid_prefs,prefsName);
  cVar1 = Fl_Button::value((Fl_Button *)prevpos_button);
  if (cVar1 != '\0') {
    Fl_Preferences::get((Fl_Preferences *)local_40,"x",&W_local,W_local);
    Fl_Preferences::get((Fl_Preferences *)local_40,"y",(int *)((long)&pos.rootNode + 4),
                        pos.rootNode._4_4_);
    if ((int)pos.rootNode == 0) {
      Fl_Widget::position((Fl_Widget *)prefsName_local,W_local,pos.rootNode._4_4_);
    }
    else {
      Fl_Preferences::get((Fl_Preferences *)local_40,"w",(int *)&pos.rootNode,(int)pos.rootNode);
      Fl_Preferences::get((Fl_Preferences *)local_40,"h",&H,H);
      (**(code **)(*(long *)prefsName_local + 0x20))
                (prefsName_local,W_local,pos.rootNode._4_4_,(int)pos.rootNode,H);
    }
  }
  Fl_Preferences::get((Fl_Preferences *)local_40,"visible",&Y_local,Y_local);
  cVar1 = (char)Y_local;
  Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_40);
  return cVar1;
}

Assistant:

char position_window(Fl_Window *w, const char *prefsName, int Visible, int X, int Y, int W=0, int H=0 ) {
  Fl_Preferences pos(fluid_prefs, prefsName);
  if (prevpos_button->value()) {
    pos.get("x", X, X);
    pos.get("y", Y, Y);
    if ( W!=0 ) {
      pos.get("w", W, W);
      pos.get("h", H, H);
      w->resize( X, Y, W, H );
    }
    else
      w->position( X, Y );
  }
  pos.get("visible", Visible, Visible);
  return Visible;
}